

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbormap.cpp
# Opt level: O0

QDataStream * operator<<(QDataStream *stream,QCborMap *value)

{
  long lVar1;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff78;
  EncodingOption in_stack_ffffffffffffff7c;
  QCborValue *in_stack_ffffffffffffff80;
  QDataStream *in_stack_ffffffffffffff88;
  QFlagsStorage<QCborValue::EncodingOption> in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QCborMap::toCborValue((QCborMap *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  QFlags<QCborValue::EncodingOption>::QFlags
            ((QFlags<QCborValue::EncodingOption> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff7c);
  QCborValue::toCbor((QCborValue *)in_RDI,(EncodingOptions)in_stack_ffffffffffffffdc.i);
  operator<<(in_stack_ffffffffffffff88,(QByteArray *)in_stack_ffffffffffffff80);
  QByteArray::~QByteArray((QByteArray *)0x477940);
  QCborValue::~QCborValue(in_stack_ffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator<<(QDataStream &stream, const QCborMap &value)
{
    stream << value.toCborValue().toCbor();
    return stream;
}